

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O2

string * __thiscall lan::db::pop_next(string *__return_storage_ptr__,db *this,string *content)

{
  char target;
  ulong spoint;
  size_type sVar1;
  size_type sVar2;
  db *pdVar3;
  db *this_00;
  allocator<char> local_f0 [32];
  string local_d0;
  string local_b0;
  undefined1 local_90 [32];
  string local_70 [2];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)(local_90 + 0x20)," \n\t",local_f0);
  pdVar3 = (db *)local_90;
  std::__cxx11::string::string((string *)pdVar3,(string *)content);
  spoint = str_find_first_not_of(pdVar3,(string *)(local_90 + 0x20),(string *)local_90,0);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)(local_90 + 0x20));
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"=:;()[] \n\t",local_f0);
  std::__cxx11::string::string((string *)&local_d0,(string *)content);
  sVar1 = str_find_first_of(this,&local_b0,&local_d0,spoint);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  sVar2 = sVar1;
  if ((long)sVar1 < 1) {
    sVar2 = content->_M_string_length;
  }
  if (-1 < (long)spoint) {
    sVar1 = sVar2;
  }
  if ((long)(sVar1 | spoint) < 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",local_f0)
    ;
  }
  else {
    target = (content->_M_dataplus)._M_p[spoint];
    pdVar3 = (db *)(local_90 + 0x40);
    this_00 = pdVar3;
    std::__cxx11::string::string<std::allocator<char>>((string *)pdVar3,",=:;([])",local_f0);
    str_compare(this_00,target,(string *)pdVar3);
    std::__cxx11::string::~string((string *)pdVar3);
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)content);
    std::__cxx11::string::substr((ulong)local_f0,(ulong)content);
    std::__cxx11::string::operator=((string *)content,(string *)local_f0);
    std::__cxx11::string::~string((string *)local_f0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string db::pop_next(std::string & content){
            ssize_t start_p = str_find_first_not_of(" \n\t\0", content, 0);
            ssize_t end_p = str_find_first_of("=:;()[] \n\t\0", content, start_p);
            end_p = (end_p <= 0 and start_p >= 0) ? content.length() : end_p;
            if (start_p >= 0 and end_p >= 0){
                end_p = (str_compare(content[start_p], ",=:;([])")) ? start_p+1 : end_p;
                std::string str = content.substr(start_p, end_p-start_p);
                content = content.substr(end_p, content.length() - str.length());
                return str;
            } else return "";
        }